

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O2

void __thiscall
Exttpose::sort_get_l2
          (Exttpose *this,int *l2cnt,fstream *file,ofstream *ofd,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *cntary,bool use_seq)

{
  pointer piVar1;
  ExttposeArgument *pEVar2;
  unsigned_long flen;
  ulong uVar3;
  runtime_error *this_00;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  int *unaff_RBP;
  int iVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  uint local_78;
  int local_74;
  ofstream *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_68;
  int itbuf [3];
  
  local_70 = ofd;
  local_68 = cntary;
  flen = file_size(file);
  if (flen != 0) {
    unaff_RBP = read_file(file,flen);
    if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Error reading file.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    qsort(unaff_RBP,flen >> 3,8,cmp2it);
  }
  local_78 = 0;
  uVar3 = this->numfreq;
  iVar7 = 0;
  uVar4 = uVar3;
  uVar8 = 0;
  while (uVar10 = uVar8, uVar10 < uVar4) {
    uVar6 = uVar10 + 1 & 0xffffffff;
    if (this->args->use_seq != 0) {
      uVar6 = 0;
    }
    for (; uVar8 = uVar10 + 1, uVar6 < uVar4; uVar6 = uVar6 + 1) {
      local_78 = 0;
      if ((flen != 0) && (uVar8 = (ulong)iVar7, local_78 = 0, uVar8 < flen / 4)) {
        piVar1 = (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_78 = 0;
        while (((uVar8 < flen / 4 && (uVar10 == (uint)piVar1[unaff_RBP[uVar8]])) &&
               (uVar6 == (uint)piVar1[unaff_RBP[uVar8 + 1]]))) {
          local_78 = local_78 + 0x100;
          uVar8 = uVar8 + 2;
        }
        iVar7 = (int)uVar8;
      }
      pEVar2 = this->args;
      if (pEVar2->use_seq == 0) {
        pbVar5 = (local_68->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start +
                 (int)(~(uint)uVar10 + (int)uVar6 +
                      (this->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10]);
      }
      else {
        pbVar5 = (local_68->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar6 + uVar4 * uVar10;
      }
      local_78 = local_78 | *pbVar5;
      if (pEVar2->MINSUPPORT <= (long)(ulong)local_78) {
        puVar9 = &local_78;
        if (pEVar2->write_only_fcnt == 0) {
          piVar1 = (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          itbuf[0] = piVar1[uVar10];
          itbuf[1] = piVar1[uVar6];
          puVar9 = (uint *)itbuf;
          itbuf[2] = local_78;
        }
        local_74 = iVar7;
        std::ostream::write((char *)local_70,(long)puVar9);
        *l2cnt = *l2cnt + 1;
        uVar3 = this->numfreq;
        iVar7 = local_74;
      }
      uVar4 = uVar3;
    }
  }
  if (unaff_RBP != (int *)0x0 && flen != 0) {
    operator_delete__(unaff_RBP);
  }
  return;
}

Assistant:

void Exttpose::sort_get_l2(int &l2cnt, fstream &file, ofstream &ofd, vector<unsigned char> &cntary, bool use_seq) {
    //write 2-itemsets counts to file

    int i, j, k;
    int fcnt;
    int lit;
    int itbuf[3];
    int *sortary;

    unsigned long filesize = file_size(file);

    if (filesize > 0) {
        sortary = read_file(file, filesize);

        if (!file) {
            throw runtime_error("Error reading file.");
        }
        qsort(sortary, (filesize / sizeof(int)) / 2, 2 * INT_SIZE, cmp2it);
    }

    unsigned long numel = filesize / INT_SIZE;
    i = 0;
    fcnt = 0;
    for (j = 0; j < numfreq; j++) {
        if (args.use_seq) k = 0;
        else k = j + 1;
        for (; k < numfreq; k++) {
            fcnt = 0;
            if (filesize > 0 && i < numel) {
                while (i < numel &&
                       j == freqidx[sortary[i]] && k == freqidx[sortary[i + 1]]) {
                    fcnt += 256;
                    i += 2;
                }
            }
            if (args.use_seq) fcnt += (int) cntary[j * numfreq + k];
            else {
                lit = j;
                lit = (offsets[lit] - lit - 1);
                fcnt += (int) cntary[lit + k];
            }

            if (fcnt >= args.MINSUPPORT) {
                if (args.write_only_fcnt) {
                    ofd.write((char *) &fcnt, INT_SIZE);
                } else {
                    itbuf[0] = backidx[j];
                    itbuf[1] = backidx[k];
                    itbuf[2] = fcnt;
                    ofd.write((char *) itbuf, 3 * sizeof(int));
                }
                l2cnt++;
            }
        }
    }
    if (filesize > 0) delete[] sortary;
}